

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaHash.c
# Opt level: O0

int Gia_ManHashMux(Gia_Man_t *p,int iCtrl,int iData1,int iData0)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int fCompl;
  int iTemp1;
  int iTemp0;
  int iData0_local;
  int iData1_local;
  int iCtrl_local;
  Gia_Man_t *p_local;
  
  if (p->fGiaSimple == 0) {
    iTemp1 = iData0;
    iTemp0 = iData1;
    iData0_local = iCtrl;
    if (iData1 < iData0) {
      iData0_local = Abc_LitNot(iCtrl);
      iTemp1 = iData1;
      iTemp0 = iData0;
    }
    iVar1 = Abc_LitIsCompl(iTemp0);
    if (iVar1 != 0) {
      iTemp1 = Abc_LitNot(iTemp1);
      iTemp0 = Abc_LitNot(iTemp0);
    }
    iVar2 = Abc_LitNot(iData0_local);
    iVar2 = Gia_ManHashAnd(p,iVar2,iTemp1);
    iVar3 = Gia_ManHashAnd(p,iData0_local,iTemp0);
    iVar2 = Abc_LitNot(iVar2);
    iVar3 = Abc_LitNot(iVar3);
    iVar2 = Gia_ManHashAnd(p,iVar2,iVar3);
    p_local._4_4_ = Abc_LitNotCond(iVar2,(uint)((iVar1 != 0 ^ 0xffU) & 1));
  }
  else {
    iVar1 = Gia_ManHashAnd(p,iCtrl,iData1);
    iVar2 = Abc_LitNot(iCtrl);
    iVar2 = Gia_ManHashAnd(p,iVar2,iData0);
    p_local._4_4_ = Gia_ManHashOr(p,iVar1,iVar2);
  }
  return p_local._4_4_;
}

Assistant:

int Gia_ManHashMux( Gia_Man_t * p, int iCtrl, int iData1, int iData0 )  
{ 
    if ( p->fGiaSimple )
        return Gia_ManHashOr(p, Gia_ManHashAnd(p, iCtrl, iData1), Gia_ManHashAnd(p, Abc_LitNot(iCtrl), iData0) );
    else
    {
        int iTemp0, iTemp1, fCompl = 0;
        if ( iData0 > iData1 )
            iData0 ^= iData1, iData1 ^= iData0, iData0 ^= iData1, iCtrl = Abc_LitNot(iCtrl);
        if ( Abc_LitIsCompl(iData1) )
            iData0 = Abc_LitNot(iData0), iData1 = Abc_LitNot(iData1), fCompl = 1;
        iTemp0 = Gia_ManHashAnd( p, Abc_LitNot(iCtrl), iData0 );
        iTemp1 = Gia_ManHashAnd( p, iCtrl, iData1 );
        return Abc_LitNotCond( Gia_ManHashAnd( p, Abc_LitNot(iTemp0), Abc_LitNot(iTemp1) ), !fCompl );
    }
}